

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Performance::anon_unknown_1::UploadWaitDrawCase::~UploadWaitDrawCase
          (UploadWaitDrawCase *this)

{
  ~UploadWaitDrawCase(this);
  operator_delete(this,0x138);
  return;
}

Assistant:

UploadWaitDrawCase::~UploadWaitDrawCase (void)
{
	deinit();
}